

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O2

void png_check_chunk_name(png_const_structrp png_ptr,png_uint_32 chunk_name)

{
  int iVar1;
  png_uint_32 cn;
  bool bVar2;
  
  iVar1 = 4;
  while( true ) {
    bVar2 = iVar1 == 0;
    iVar1 = iVar1 + -1;
    if (bVar2) {
      return;
    }
    if (((chunk_name & 0xff) - 0x7b < 0xffffffc6) || ((chunk_name & 0xff) - 0x5b < 6)) break;
    chunk_name = chunk_name >> 8;
  }
  png_chunk_error(png_ptr,"invalid chunk type");
}

Assistant:

void /* PRIVATE */
png_check_chunk_name(png_const_structrp png_ptr, png_uint_32 chunk_name)
{
   int i;
   png_uint_32 cn=chunk_name;

   png_debug(1, "in png_check_chunk_name");

   for (i=1; i<=4; ++i)
   {
      int c = cn & 0xff;

      if (c < 65 || c > 122 || (c > 90 && c < 97))
         png_chunk_error(png_ptr, "invalid chunk type");

      cn >>= 8;
   }
}